

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::cmState(cmState *this,Mode mode,ProjectKind projectKind)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_cmCacheManager_*,_false> _Var2;
  _Head_base<0UL,_cmCacheManager_*,_false> local_88;
  unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_> *local_80;
  
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuiltinCommands)._M_h._M_buckets = &(this->BuiltinCommands)._M_h._M_single_bucket;
  (this->BuiltinCommands)._M_h._M_bucket_count = 1;
  (this->BuiltinCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->BuiltinCommands)._M_h._M_element_count = 0;
  (this->BuiltinCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->BuiltinCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->BuiltinCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ScriptedCommands)._M_h._M_buckets = &(this->ScriptedCommands)._M_h._M_single_bucket;
  (this->ScriptedCommands)._M_h._M_bucket_count = 1;
  (this->ScriptedCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ScriptedCommands)._M_h._M_element_count = 0;
  (this->ScriptedCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ScriptedCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ScriptedCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FlowControlCommands)._M_h._M_buckets = &(this->FlowControlCommands)._M_h._M_single_bucket;
  (this->FlowControlCommands)._M_h._M_bucket_count = 1;
  (this->FlowControlCommands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FlowControlCommands)._M_h._M_element_count = 0;
  (this->FlowControlCommands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->FlowControlCommands)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FlowControlCommands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GlobalProperties).Map_._M_h._M_buckets =
       &(this->GlobalProperties).Map_._M_h._M_single_bucket;
  (this->GlobalProperties).Map_._M_h._M_bucket_count = 1;
  (this->GlobalProperties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GlobalProperties).Map_._M_h._M_element_count = 0;
  (this->GlobalProperties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_80 = &this->GlobVerificationManager;
  memset(&(this->GlobalProperties).Map_._M_h._M_rehash_policy._M_next_resize,0,0x110);
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)&(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_string_length = 0;
  (this->BinaryDirectory).field_2._M_local_buf[0] = '\0';
  this->NinjaMulti = false;
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this->StateMode = mode;
  this->StateProjectKind = projectKind;
  (this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>._M_payload.
  super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
  super__Optional_payload_base<cmDependencyProvider>._M_engaged = false;
  this->ProcessingTopLevelIncludes = false;
  std::make_unique<cmCacheManager>();
  _Var2._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (cmCacheManager *)0x0;
  std::__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>::reset
            ((__uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_> *)
             &this->CacheManager,_Var2._M_head_impl);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr
            ((unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> *)&local_88);
  std::make_unique<cmGlobVerificationManager>();
  _Var2._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (cmCacheManager *)0x0;
  std::__uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  reset((__uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
         *)local_80,(pointer)_Var2._M_head_impl);
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  ~unique_ptr((unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
               *)&local_88);
  return;
}

Assistant:

cmState::cmState(Mode mode, ProjectKind projectKind)
  : StateMode(mode)
  , StateProjectKind(projectKind)
{
  this->CacheManager = cm::make_unique<cmCacheManager>();
  this->GlobVerificationManager = cm::make_unique<cmGlobVerificationManager>();
}